

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.hpp
# Opt level: O0

value_type * __thiscall
toml::result<toml::detail::region,_toml::detail::none_t>::unwrap
          (result<toml::detail::region,_toml::detail::none_t> *this)

{
  bool bVar1;
  runtime_error *this_00;
  error_type *others;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  result<toml::detail::region,_toml::detail::none_t> *local_10;
  result<toml::detail::region,_toml::detail::none_t> *this_local;
  
  local_10 = this;
  bVar1 = is_err(this);
  if (!bVar1) {
    return (value_type *)&this->field_1;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  others = as_err(this);
  format_error<toml::detail::none_t,_nullptr>(&local_50,others);
  std::operator+(&local_30,"toml::result: bad unwrap: ",&local_50);
  std::runtime_error::runtime_error(this_00,(string *)&local_30);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

value_type const& unwrap() const&
    {
        if(is_err())
        {
            throw std::runtime_error("toml::result: bad unwrap: " +
                                     format_error(this->as_err()));
        }
        return this->succ.value;
    }